

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O2

Bit32u __thiscall MT32Emu::LA32Ramp::nextValue(LA32Ramp *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  if (0 < this->interruptCountdown) {
    iVar3 = this->interruptCountdown + -1;
    this->interruptCountdown = iVar3;
    if (iVar3 == 0) {
      this->interruptRaised = true;
    }
    goto LAB_0016394a;
  }
  uVar1 = this->largeIncrement;
  if (uVar1 == 0) goto LAB_0016394a;
  uVar2 = this->current;
  if (this->descending == true) {
    if (uVar2 < uVar1) goto LAB_0016392f;
    this->current = uVar2 - uVar1;
    uVar4 = this->largeTarget;
    if (uVar4 < uVar2 - uVar1) goto LAB_0016394a;
LAB_00163941:
    this->current = uVar4;
  }
  else {
    if (uVar1 <= 0x3fc0000 - uVar2) {
      this->current = uVar2 + uVar1;
      uVar4 = this->largeTarget;
      if (uVar2 + uVar1 < uVar4) goto LAB_0016394a;
      goto LAB_00163941;
    }
LAB_0016392f:
    this->current = this->largeTarget;
  }
  this->interruptCountdown = 7;
LAB_0016394a:
  return this->current;
}

Assistant:

Bit32u LA32Ramp::nextValue() {
	if (interruptCountdown > 0) {
		if (--interruptCountdown == 0) {
			interruptRaised = true;
		}
	} else if (largeIncrement != 0) {
		// CONFIRMED from sample analysis: When increment is 0, the LA32 does *not* change the current value at all (and of course doesn't fire an interrupt).
		if (descending) {
			// Lowering current value
			if (largeIncrement > current) {
				current = largeTarget;
				interruptCountdown = INTERRUPT_TIME;
			} else {
				current -= largeIncrement;
				if (current <= largeTarget) {
					current = largeTarget;
					interruptCountdown = INTERRUPT_TIME;
				}
			}
		} else {
			// Raising current value
			if (MAX_CURRENT - current < largeIncrement) {
				current = largeTarget;
				interruptCountdown = INTERRUPT_TIME;
			} else {
				current += largeIncrement;
				if (current >= largeTarget) {
					current = largeTarget;
					interruptCountdown = INTERRUPT_TIME;
				}
			}
		}
	}
	return current;
}